

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall absl::lts_20250127::ByChar::Find(ByChar *this,string_view text,size_t pos)

{
  size_type __pos;
  const_pointer pvVar1;
  size_type sVar2;
  string_view sVar3;
  size_t found_pos;
  size_t pos_local;
  ByChar *this_local;
  string_view text_local;
  char *local_10;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (ByChar *)text._M_len;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,this->c_,pos);
  if (__pos == 0xffffffffffffffff) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,pvVar1 + sVar2
               ,0);
  }
  else {
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__pos,1);
  }
  sVar3._M_len = (size_t)text_local._M_str;
  sVar3._M_str = local_10;
  return sVar3;
}

Assistant:

absl::string_view ByChar::Find(absl::string_view text, size_t pos) const {
  size_t found_pos = text.find(c_, pos);
  if (found_pos == absl::string_view::npos)
    return absl::string_view(text.data() + text.size(), 0);
  return text.substr(found_pos, 1);
}